

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O2

void __thiscall
Master::freeROMImages(Master *this,ROMImage **controlROMImage,ROMImage **pcmROMImage)

{
  const_iterator cVar1;
  const_iterator cVar2;
  File *pFVar3;
  bool bVar4;
  bool bVar5;
  ROMImage *synthPCMROMImage;
  ROMImage *synthControlROMImage;
  QForeachContainer<QList<SynthRoute_*>_> _container_558;
  ROMImage *local_70;
  ROMImage *local_68;
  QForeachContainer<QList<SynthRoute_*>_> local_60;
  
  if (*pcmROMImage != (ROMImage *)0x0 || *controlROMImage != (ROMImage *)0x0) {
    local_68 = (ROMImage *)0x0;
    local_70 = (ROMImage *)0x0;
    if (this->audioFileWriterSynth == (QSynth *)0x0) {
      bVar5 = false;
      bVar4 = false;
    }
    else {
      QSynth::getROMImages(this->audioFileWriterSynth,&local_68,&local_70);
      bVar4 = local_68 == *controlROMImage;
      bVar5 = local_70 == *pcmROMImage;
      if (bVar4 && bVar5) {
        return;
      }
    }
    QtPrivate::QForeachContainer<QList<SynthRoute_*>_>::QForeachContainer
              (&local_60,&this->synthRoutes);
    for (; cVar2.i = local_60.e.i, cVar1.i = local_60.i.i, local_60.i.i != local_60.e.i;
        local_60.i.i = local_60.i.i + 1) {
      SynthRoute::getROMImages(*local_60.i.i,&local_68,&local_70);
      if (((bool)(bVar4 | local_68 == *controlROMImage)) &&
         ((bool)(bVar5 | local_70 == *pcmROMImage))) {
        bVar5 = true;
        bVar4 = true;
        break;
      }
      bVar4 = (bool)(bVar4 | local_68 == *controlROMImage);
      bVar5 = (bool)(bVar5 | local_70 == *pcmROMImage);
    }
    QArrayDataPointer<SynthRoute_*>::~QArrayDataPointer
              ((QArrayDataPointer<SynthRoute_*> *)&local_60);
    if (cVar1.i == cVar2.i) {
      if ((!bVar4) && (*controlROMImage != (ROMImage *)0x0)) {
        bVar4 = MT32Emu::ROMImage::isFileUserProvided(*controlROMImage);
        if ((bVar4) &&
           (pFVar3 = MT32Emu::ROMImage::getFile(*controlROMImage), pFVar3 != (File *)0x0)) {
          (*pFVar3->_vptr_File[1])(pFVar3);
        }
        MT32Emu::ROMImage::freeROMImage(*controlROMImage);
        *controlROMImage = (ROMImage *)0x0;
      }
      if ((!bVar5) && (*pcmROMImage != (ROMImage *)0x0)) {
        bVar4 = MT32Emu::ROMImage::isFileUserProvided(*pcmROMImage);
        if ((bVar4) && (pFVar3 = MT32Emu::ROMImage::getFile(*pcmROMImage), pFVar3 != (File *)0x0)) {
          (*pFVar3->_vptr_File[1])(pFVar3);
        }
        MT32Emu::ROMImage::freeROMImage(*pcmROMImage);
        *pcmROMImage = (ROMImage *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Master::freeROMImages(const MT32Emu::ROMImage *&controlROMImage, const MT32Emu::ROMImage *&pcmROMImage) const {
	if (controlROMImage == NULL && pcmROMImage == NULL) return;
	bool controlROMInUse = false;
	bool pcmROMInUse = false;
	const MT32Emu::ROMImage *synthControlROMImage = NULL;
	const MT32Emu::ROMImage *synthPCMROMImage = NULL;
	if (audioFileWriterSynth != NULL) {
		audioFileWriterSynth->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = synthControlROMImage == controlROMImage;
		pcmROMInUse = synthPCMROMImage == pcmROMImage;
		if (controlROMInUse && pcmROMInUse) return;
	}
	foreach (SynthRoute *synthRoute, synthRoutes) {
		synthRoute->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = controlROMInUse || (synthControlROMImage == controlROMImage);
		pcmROMInUse = pcmROMInUse || (synthPCMROMImage == pcmROMImage);
		if (controlROMInUse && pcmROMInUse) return;
	}
	if (!controlROMInUse && controlROMImage != NULL) {
		if (controlROMImage->isFileUserProvided()) delete controlROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(controlROMImage);
		controlROMImage = NULL;
	}
	if (!pcmROMInUse && pcmROMImage != NULL) {
		if (pcmROMImage->isFileUserProvided()) delete pcmROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(pcmROMImage);
		pcmROMImage = NULL;
	}
}